

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

reporterMap * doctest::anon_unknown_14::getReporters(void)

{
  int iVar1;
  
  if ((anonymous_namespace)::getReporters()::data == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::getReporters()::data);
    if (iVar1 != 0) {
      std::
      map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
      ::map((map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
             *)0x1140b7);
      __cxa_atexit(std::
                   map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
                   ::~map,&getReporters::data,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::getReporters()::data);
    }
  }
  return &getReporters::data;
}

Assistant:

reporterMap& getReporters() {
        static reporterMap data;
        return data;
    }